

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O0

cl_uint __thiscall CLIntercept::getRefCount(CLIntercept *this,cl_event event)

{
  cl_icd_dispatch *pcVar1;
  cl_event in_RSI;
  CLIntercept *in_RDI;
  cl_uint refCount;
  cl_uint local_14;
  cl_event local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  pcVar1 = dispatch(in_RDI);
  (*pcVar1->clGetEventInfo)(local_10,0x11d2,4,&local_14,(size_t *)0x0);
  return local_14;
}

Assistant:

inline cl_uint CLIntercept::getRefCount( cl_event event ) const
{
    cl_uint refCount = 0;
    dispatch().clGetEventInfo(
        event,
        CL_EVENT_REFERENCE_COUNT,
        sizeof(refCount),
        &refCount,
        NULL);
    return refCount;
}